

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silnia.c
# Opt level: O2

void * callable_number(void *arg,size_t size,size_t *res_size)

{
  void *pvVar1;
  void *pvVar2;
  
  *res_size = 8;
  pvVar1 = *arg;
  for (pvVar2 = pvVar1; (long)pvVar2 <= *(long *)((long)arg + 8);
      pvVar2 = (void *)((long)pvVar2 + 3)) {
    pvVar1 = (void *)((long)pvVar1 * (long)pvVar2);
  }
  return pvVar1;
}

Assistant:

void* callable_number(void* arg, size_t size, size_t* res_size) {
    *res_size = sizeof(long long);
    arg_t* my_arg = arg;
    long long liczba = my_arg->x;
    long long wynik = my_arg->x;
    while(liczba <= my_arg->limit) {
        wynik *= liczba;
        liczba += 3;
    }
    return (void *)wynik;
}